

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

BOOL __thiscall GlobOpt::PRE::PreloadPRECandidate(PRE *this,Loop *loop,GlobHashBucket *candidate)

{
  SymID stackSymID;
  int32 propertyId;
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint32 propertyIdIndex;
  ValueNumber VVar6;
  ValueNumber VVar7;
  uint uVar8;
  undefined4 *puVar9;
  ValueInfo *pVVar10;
  Instr **ppIVar11;
  Opnd *pOVar12;
  Instr *this_00;
  StackSym *sym;
  RegOpnd *newDst;
  Value *pVVar13;
  FldInfo *pFVar14;
  ProfiledInstr *pPVar15;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar16;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar17;
  BasicBlock *this_01;
  BasicBlock *local_c0;
  BasicBlock *local_b8;
  Value *local_98;
  Value *initialValue;
  PropertySym *pPStack_88;
  ValueType valueType;
  PropertySym *newPropSym;
  Value *objPtrValue;
  Instr *ldInstr;
  Instr *local_68;
  Instr *ldInstrInLoop;
  Value *landingPadValue;
  Sym *symStore;
  BasicBlock *landingPad;
  Sym *objPtrCopyPropSym;
  StackSym *objPtrSym;
  Value *propSymValueOnBackEdge;
  PropertySym *propertySym;
  GlobHashBucket *candidate_local;
  Loop *loop_local;
  PRE *this_local;
  
  propertySym = (PropertySym *)candidate;
  candidate_local = (GlobHashBucket *)loop;
  loop_local = (Loop *)this;
  propSymValueOnBackEdge = (Value *)Sym::AsPropertySym(candidate->value);
  BVar2 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->candidates->candidatesToProcess,
                     (((PropertySym *)propSymValueOnBackEdge)->super_Sym).m_id);
  if (BVar2 == '\0') {
    return 0;
  }
  objPtrSym = (StackSym *)(propertySym->super_Sym)._vptr_Sym;
  objPtrCopyPropSym = *(Sym **)(propSymValueOnBackEdge + 2);
  landingPad = (BasicBlock *)0x0;
  bVar3 = GlobOptBlockData::IsLive
                    ((GlobOptBlockData *)&candidate_local[4].value[8].m_id,objPtrCopyPropSym);
  if (!bVar3) {
    uVar4 = Func::GetSourceContextId(this->globOpt->func);
    uVar5 = Func::GetLocalFunctionId(this->globOpt->func);
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,MakeObjSymLiveInLandingPadPhase,uVar4,uVar5);
    if (bVar3) {
      return 0;
    }
    bVar3 = StackSym::IsSingleDef((StackSym *)objPtrCopyPropSym);
    if (!bVar3) {
      TraceFailedPreloadInLandingPad
                (this,(Loop *)candidate_local,(PropertySym *)propSymValueOnBackEdge,
                 L"Object sym not live in landing pad and not single-def");
      return 0;
    }
    bVar3 = InsertSymDefinitionInLandingPad
                      (this,(StackSym *)objPtrCopyPropSym,(Loop *)candidate_local,
                       (Sym **)&landingPad);
    if (!bVar3) {
      TraceFailedPreloadInLandingPad
                (this,(Loop *)candidate_local,(PropertySym *)propSymValueOnBackEdge,
                 L"Failed to insert load of object sym in landing pad");
      return 0;
    }
  }
  bVar3 = GlobOptBlockData::IsLive
                    ((GlobOptBlockData *)&candidate_local[4].value[8].m_id,objPtrCopyPropSym);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3f5,"(loop->landingPad->globOptData.IsLive(objPtrSym))",
                       "loop->landingPad->globOptData.IsLive(objPtrSym)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  symStore = candidate_local[4].value;
  pVVar10 = ::Value::GetValueInfo((Value *)objPtrSym);
  landingPadValue = (Value *)ValueInfo::GetSymStore(pVVar10);
  if (((Sym *)landingPadValue == (Sym *)0x0) ||
     (bVar3 = Sym::IsStackSym((Sym *)landingPadValue), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3fc,"(symStore && symStore->IsStackSym())",
                       "symStore && symStore->IsStackSym()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar3 = GlobOptBlockData::IsLive
                    ((GlobOptBlockData *)&candidate_local[4].value[8].m_id,(Sym *)landingPadValue);
  if (!bVar3) {
    ldInstrInLoop =
         (Instr *)GlobOptBlockData::FindValue
                            ((GlobOptBlockData *)&symStore[8].m_id,(Sym *)propSymValueOnBackEdge);
    if (ldInstrInLoop == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x408,"(landingPadValue)","landingPadValue");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    ldInstr = (Instr *)0x0;
    ppIVar11 = JsUtil::
               BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Lookup(this->globOpt->prePassInstrMap,&propSymValueOnBackEdge[1].valueNumber,
                        &ldInstr);
    local_68 = *ppIVar11;
    if (local_68 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x40b,"(ldInstrInLoop)","ldInstrInLoop");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pOVar12 = IR::Instr::GetDst(local_68);
    if (pOVar12 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x40c,"(ldInstrInLoop->GetDst() == nullptr)",
                         "ldInstrInLoop->GetDst() == nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar3 = IsPREInstrCandidateLoad(local_68->m_opcode);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x40f,"(IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode))",
                         "IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode)");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    this_00 = InsertPropertySymPreloadInLandingPad
                        (this,local_68,(Loop *)candidate_local,(PropertySym *)propSymValueOnBackEdge
                        );
    if (this_00 != (Instr *)0x0) {
      pOVar12 = IR::Instr::GetDst(this_00);
      if (pOVar12 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x417,"(ldInstr->GetDst() == nullptr)","ldInstr->GetDst() == nullptr");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      sym = Sym::AsStackSym((Sym *)landingPadValue);
      newDst = IR::RegOpnd::New(sym,TyVar,this->globOpt->func);
      IR::Instr::SetDst(this_00,&newDst->super_Opnd);
      BVSparse<Memory::JitArenaAllocator>::Set
                ((BVSparse<Memory::JitArenaAllocator> *)candidate_local[0x10].element,
                 landingPadValue[1].valueNumber);
      BVSparse<Memory::JitArenaAllocator>::Set
                (*(BVSparse<Memory::JitArenaAllocator> **)&symStore[10].m_id,
                 landingPadValue[1].valueNumber);
      pVVar13 = GlobOptBlockData::FindValue((GlobOptBlockData *)&symStore[8].m_id,objPtrCopyPropSym)
      ;
      if (landingPad == (BasicBlock *)0x0) {
        if (pVVar13 == (Value *)0x0) {
          local_c0 = (BasicBlock *)0x0;
        }
        else {
          local_c0 = (BasicBlock *)
                     GlobOptBlockData::GetCopyPropSym
                               ((GlobOptBlockData *)&symStore[8].m_id,objPtrCopyPropSym,pVVar13);
        }
        local_b8 = local_c0;
      }
      else {
        local_b8 = landingPad;
      }
      landingPad = local_b8;
      if (local_b8 != (BasicBlock *)0x0) {
        stackSymID = *(SymID *)&local_b8->loop;
        propertyId = *(int32 *)&propSymValueOnBackEdge[1].valueInfo;
        propertyIdIndex = PropertySym::GetPropertyIdIndex((PropertySym *)propSymValueOnBackEdge);
        uVar4 = PropertySym::GetInlineCacheIndex((PropertySym *)propSymValueOnBackEdge);
        pPStack_88 = PropertySym::FindOrCreate
                               (stackSymID,propertyId,propertyIdIndex,uVar4,
                                propSymValueOnBackEdge[1].field_0x5,this->globOpt->func);
        pVVar13 = GlobOptBlockData::FindValue
                            ((GlobOptBlockData *)&symStore[8].m_id,&pPStack_88->super_Sym);
        if (pVVar13 == (Value *)0x0) {
          GlobOptBlockData::SetValue
                    ((GlobOptBlockData *)&symStore[8].m_id,(Value *)ldInstrInLoop,
                     &pPStack_88->super_Sym);
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((BVSparse<Memory::JitArenaAllocator> *)symStore[9].m_next,
                     (pPStack_88->super_Sym).m_id);
          MakePropertySymLiveOnBackEdges(this,pPStack_88,(Loop *)candidate_local,(Value *)objPtrSym)
          ;
        }
      }
      initialValue._6_2_ = ValueType::Uninitialized.field_0;
      local_98 = (Value *)0x0;
      bVar3 = JsUtil::
              BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<PropertySym*>
                        ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)&candidate_local[0x10].value,(PropertySym **)&propSymValueOnBackEdge,
                         &local_98);
      if (bVar3) {
        bVar3 = IR::Instr::IsProfiledInstr(this_00);
        if (bVar3) {
          VVar6 = ::Value::GetValueNumber(local_98);
          VVar7 = ::Value::GetValueNumber((Value *)objPtrSym);
          if (VVar6 == VVar7) {
            pVVar10 = ::Value::GetValueInfo((Value *)objPtrSym);
            bVar3 = ValueType::IsUninitialized(&pVVar10->super_ValueType);
            if (bVar3) {
              pPVar15 = IR::Instr::AsProfiledInstr(this_00);
              pFVar14 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                                  ((anon_union_8_4_88fdcd80 *)&(pPVar15->u).field_3);
              initialValue._6_2_ =
                   *(anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                    &(pFVar14->valueType).field_0;
            }
            else {
              pVVar10 = ::Value::GetValueInfo((Value *)objPtrSym);
              paVar17 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                        ValueInfo::Type(pVVar10);
              initialValue._6_2_ = *paVar17;
            }
          }
          else {
            initialValue._6_2_ = ValueType::Uninitialized.field_0;
          }
          pPVar15 = IR::Instr::AsProfiledInstr(this_00);
          paVar16 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                    IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                              ((anon_union_8_4_88fdcd80 *)&(pPVar15->u).field_3);
          paVar16->field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               initialValue._6_2_;
        }
      }
      else {
        pVVar10 = ::Value::GetValueInfo((Value *)ldInstrInLoop);
        paVar17 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                  ValueInfo::Type(pVVar10);
        initialValue._6_2_ = *paVar17;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                ((BVSparse<Memory::JitArenaAllocator> *)candidate_local[8].value,
                 landingPadValue[1].valueNumber);
      bVar3 = ValueType::IsLikelyNumber((ValueType *)((long)&initialValue + 6));
      if (bVar3) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((BVSparse<Memory::JitArenaAllocator> *)candidate_local[9].value,
                   landingPadValue[1].valueNumber);
        bVar3 = DoAggressiveIntTypeSpec(this->globOpt);
        if (bVar3) {
          bVar3 = ValueType::IsLikelyInt((ValueType *)((long)&initialValue + 6));
        }
        else {
          bVar3 = ValueType::IsInt((ValueType *)((long)&initialValue + 6));
        }
        if (bVar3) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((BVSparse<Memory::JitArenaAllocator> *)candidate_local[9].element,
                     landingPadValue[1].valueNumber);
        }
      }
      uVar4 = Func::GetSourceContextId(this->globOpt->func);
      uVar5 = Func::GetLocalFunctionId(this->globOpt->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FieldPREPhase,uVar4,uVar5);
      if (bVar3) {
        this_01 = Loop::GetHeadBlock((Loop *)candidate_local);
        uVar8 = BasicBlock::GetBlockNum(this_01);
        Output::Print(L"** TRACE: Field PRE: field pre-loaded in landing pad of loop head #%-3d: ",
                      (ulong)uVar8);
        IR::Instr::Dump(this_00);
        Output::Print(L"\n");
        Output::Flush();
      }
      return 1;
    }
    return 0;
  }
  return 0;
}

Assistant:

BOOL GlobOpt::PRE::PreloadPRECandidate(Loop *loop, GlobHashBucket* candidate)
{
    // Insert a load for each field PRE candidate.
    PropertySym *propertySym = candidate->value->AsPropertySym();
    if (!candidates->candidatesToProcess->TestAndClear(propertySym->m_id))
    {
        return false;
    }
    Value * propSymValueOnBackEdge = candidate->element;

    StackSym *objPtrSym = propertySym->m_stackSym;
    Sym * objPtrCopyPropSym = nullptr;

    if (!loop->landingPad->globOptData.IsLive(objPtrSym))
    {
        if (PHASE_OFF(Js::MakeObjSymLiveInLandingPadPhase, this->globOpt->func))
        {
            return false;
        }
        if (objPtrSym->IsSingleDef())
        {
            // We can still try to do PRE if the object sym is single def, even if its not live in the landing pad.
            // We'll have to add a def instruction for the object sym in the landing pad, and then we can continue
            // pre-loading the current PRE candidate.
            // Case in point:
            // $L1            
            //                value|symStore
            //      t1 = o.x    (v1|t3)
            //      t2 = t1.y   (v2|t4) <-- t1 is not live in the loop landing pad
            //      jmp $L1

            if (!InsertSymDefinitionInLandingPad(objPtrSym, loop, &objPtrCopyPropSym))
            {
#if DBG_DUMP
                TraceFailedPreloadInLandingPad(loop, propertySym, _u("Failed to insert load of object sym in landing pad"));
#endif
                return false;
            }
        }
        else
        {
#if DBG_DUMP
            TraceFailedPreloadInLandingPad(loop, propertySym, _u("Object sym not live in landing pad and not single-def"));
#endif
            return false;
        }
    }
    Assert(loop->landingPad->globOptData.IsLive(objPtrSym));

    BasicBlock *landingPad = loop->landingPad;
    Sym *symStore = propSymValueOnBackEdge->GetValueInfo()->GetSymStore();

    // The symStore can't be live into the loop
    // The symStore needs to still have the same value
    Assert(symStore && symStore->IsStackSym());

    if (loop->landingPad->globOptData.IsLive(symStore))
    {
        // May have already been hoisted:
        //  o.x = t1;
        //  o.y = t1;
        return false;
    }
    Value *landingPadValue = landingPad->globOptData.FindValue(propertySym);

    // Value should be added as initial value or already be there.
    Assert(landingPadValue);

    IR::Instr * ldInstrInLoop = this->globOpt->prePassInstrMap->Lookup(propertySym->m_id, nullptr);
    Assert(ldInstrInLoop);
    Assert(ldInstrInLoop->GetDst() == nullptr);

    // Create instr to put in landing pad for compensation
    Assert(IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode));

    IR::Instr * ldInstr = InsertPropertySymPreloadInLandingPad(ldInstrInLoop, loop, propertySym);
    if (!ldInstr)
    {
        return false;
    }

    Assert(ldInstr->GetDst() == nullptr);
    ldInstr->SetDst(IR::RegOpnd::New(symStore->AsStackSym(), TyVar, this->globOpt->func));
    loop->fieldPRESymStores->Set(symStore->m_id);
    landingPad->globOptData.liveVarSyms->Set(symStore->m_id);

    Value * objPtrValue = landingPad->globOptData.FindValue(objPtrSym);

    objPtrCopyPropSym = objPtrCopyPropSym ? objPtrCopyPropSym : objPtrValue ? landingPad->globOptData.GetCopyPropSym(objPtrSym, objPtrValue) : nullptr;
    if (objPtrCopyPropSym)
    {
        // If we inserted T4 = T1.y, and T3 is the copy prop sym for T1 in the landing pad, we need T3.y 
        // to be live on back edges to have the merge produce a value for T3.y. Having a value for T1.y 
        // produced from the merge is not enough as the T1.y in the loop will get obj-ptr-copy-propped to 
        // T3.y

        // T3.y
        PropertySym *newPropSym = PropertySym::FindOrCreate(
            objPtrCopyPropSym->m_id, propertySym->m_propertyId, propertySym->GetPropertyIdIndex(), propertySym->GetInlineCacheIndex(), propertySym->m_fieldKind, this->globOpt->func);

        if (!landingPad->globOptData.FindValue(newPropSym))
        {
            landingPad->globOptData.SetValue(landingPadValue, newPropSym);
            landingPad->globOptData.liveFields->Set(newPropSym->m_id);
            MakePropertySymLiveOnBackEdges(newPropSym, loop, propSymValueOnBackEdge);
        }
    }

    ValueType valueType(ValueType::Uninitialized);
    Value *initialValue = nullptr;

    if (loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue))
    {
        if (ldInstr->IsProfiledInstr())
        {
            if (initialValue->GetValueNumber() == propSymValueOnBackEdge->GetValueNumber())
            {
                if (propSymValueOnBackEdge->GetValueInfo()->IsUninitialized())
                {
                    valueType = ldInstr->AsProfiledInstr()->u.FldInfo().valueType;
                }
                else
                {
                    valueType = propSymValueOnBackEdge->GetValueInfo()->Type();
                }
            }
            else
            {
                valueType = ValueType::Uninitialized;
            }
            ldInstr->AsProfiledInstr()->u.FldInfo().valueType = valueType;
        }
    }
    else
    {
        valueType = landingPadValue->GetValueInfo()->Type();
    }

    loop->symsUsedBeforeDefined->Set(symStore->m_id);

    if (valueType.IsLikelyNumber())
    {
        loop->likelyNumberSymsUsedBeforeDefined->Set(symStore->m_id);
        if (globOpt->DoAggressiveIntTypeSpec() ? valueType.IsLikelyInt() : valueType.IsInt())
        {
            // Can only force int conversions in the landing pad based on likely-int values if aggressive int type
            // specialization is enabled
            loop->likelyIntSymsUsedBeforeDefined->Set(symStore->m_id);
        }
    }

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldPREPhase, this->globOpt->func->GetSourceContextId(), this->globOpt->func->GetLocalFunctionId()))
    {
        Output::Print(_u("** TRACE: Field PRE: field pre-loaded in landing pad of loop head #%-3d: "), loop->GetHeadBlock()->GetBlockNum());
        ldInstr->Dump();
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif

    return true;
}